

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O2

int Fra_ClausProcessClauses(Clu_Man_t *p,int fRefs)

{
  int iVar1;
  uint uVar2;
  abctime aVar3;
  Fra_Sml_t *pFVar4;
  abctime aVar5;
  Aig_MmFixed_t *p_00;
  void *pvVar6;
  undefined8 uVar7;
  uint uVar8;
  int iVar9;
  Aig_Man_t *pAVar10;
  Clu_Man_t *pCVar11;
  Vec_Ptr_t *pVVar12;
  uint uVar13;
  long lVar14;
  uint uVar15;
  Dar_Cut_t *pDVar16;
  uint uVar17;
  int Scores [16];
  
  aVar3 = Abc_Clock();
  Aig_ManRandom(1);
  pAVar10 = p->pAig;
  pFVar4 = Fra_SmlSimulateSeq(pAVar10,0,p->nPref + p->nSimFrames,p->nSimWords / p->nSimFrames,1);
  iVar9 = (int)pAVar10;
  if ((p->fTarget == 0) || (pFVar4->fNonConstOut == 0)) {
    if (p->fVerbose != 0) {
      Abc_Print(iVar9,"%s =","Sim-seq");
      aVar5 = Abc_Clock();
      Abc_Print(iVar9,"%9.2f sec\n",(double)(aVar5 - aVar3) / 1000000.0);
    }
    aVar3 = Abc_Clock();
    if (fRefs != 0) {
      pCVar11 = p;
      Fra_ClausCollectLatchClauses(p,pFVar4);
      iVar9 = (int)pCVar11;
      if (p->fVerbose != 0) {
        Abc_Print(iVar9,"%s =","Lat-cla");
        aVar5 = Abc_Clock();
        Abc_Print(iVar9,"%9.2f sec\n",(double)(aVar5 - aVar3) / 1000000.0);
      }
    }
    aVar3 = Abc_Clock();
    pAVar10 = p->pAig;
    iVar9 = 0;
    p_00 = Dar_ManComputeCuts(pAVar10,10,0,1);
    iVar1 = (int)pAVar10;
    if (p->fVerbose != 0) {
      Abc_Print(iVar1,"%s =","Cuts   ");
      aVar5 = Abc_Clock();
      Abc_Print(iVar1,"%9.2f sec\n",(double)(aVar5 - aVar3) / 1000000.0);
    }
    aVar3 = Abc_Clock();
    for (; pVVar12 = p->pAig->vObjs, iVar9 < pVVar12->nSize; iVar9 = iVar9 + 1) {
      pvVar6 = Vec_PtrEntry(pVVar12,iVar9);
      if ((pvVar6 != (void *)0x0) &&
         (uVar7 = *(undefined8 *)((long)pvVar6 + 0x18), 0xfffffffd < ((uint)uVar7 & 7) - 7)) {
        pDVar16 = *(Dar_Cut_t **)((long)pvVar6 + 0x28);
        for (uVar17 = 0; uVar17 < (byte)((ulong)uVar7 >> 0x38); uVar17 = uVar17 + 1) {
          if (0x3fffffff < *(uint *)&pDVar16->field_0x4 &&
              (*(uint *)&pDVar16->field_0x4 >> 0x1c & 1) != 0) {
            iVar1 = Fra_ClausProcessClausesCut(p,pFVar4,pDVar16,Scores);
            *(short *)&pDVar16->field_0x4 = (short)iVar1;
            uVar7 = *(undefined8 *)((long)pvVar6 + 0x18);
          }
          pDVar16 = pDVar16 + 1;
        }
      }
    }
    if (p->fVerbose != 0) {
      Abc_Print((int)pVVar12,"%s =","Infoseq");
      iVar9 = (int)pVVar12;
      aVar5 = Abc_Clock();
      Abc_Print(iVar9,"%9.2f sec\n",(double)(aVar5 - aVar3) / 1000000.0);
    }
    Fra_SmlStop(pFVar4);
    aVar3 = Abc_Clock();
    Aig_ManRandom(1);
    pAVar10 = p->pAig;
    iVar1 = 0;
    pFVar4 = Fra_SmlSimulateComb(pAVar10,p->nSimWordsPref + p->nSimWords,0);
    iVar9 = (int)pAVar10;
    if (p->fVerbose != 0) {
      Abc_Print(iVar9,"%s =","Sim-cmb");
      aVar5 = Abc_Clock();
      Abc_Print(iVar9,"%9.2f sec\n",(double)(aVar5 - aVar3) / 1000000.0);
    }
    aVar3 = Abc_Clock();
    uVar17 = 0;
    for (; pVVar12 = p->pAig->vObjs, iVar1 < pVVar12->nSize; iVar1 = iVar1 + 1) {
      pvVar6 = Vec_PtrEntry(pVVar12,iVar1);
      if ((pvVar6 != (void *)0x0) &&
         (uVar7 = *(undefined8 *)((long)pvVar6 + 0x18), 0xfffffffd < ((uint)uVar7 & 7) - 7)) {
        pDVar16 = *(Dar_Cut_t **)((long)pvVar6 + 0x28);
        for (uVar15 = 0; uVar15 < (byte)((ulong)uVar7 >> 0x38); uVar15 = uVar15 + 1) {
          if (0x3fffffff < *(uint *)&pDVar16->field_0x4 &&
              (*(uint *)&pDVar16->field_0x4 >> 0x1c & 1) != 0) {
            uVar17 = uVar17 + 1;
            uVar2 = Fra_ClausProcessClausesCut(p,pFVar4,pDVar16,Scores);
            uVar13 = *(uint *)&pDVar16->field_0x4;
            uVar8 = uVar13 & 0xffff0000;
            *(uint *)&pDVar16->field_0x4 = uVar8;
            uVar2 = (~uVar13 | 0xffff0000) & uVar2;
            if (uVar2 != 0) {
              for (lVar14 = 0; uVar13 = (uint)lVar14, uVar13 >> (byte)(uVar8 >> 0x1d) == 0;
                  lVar14 = lVar14 + 1) {
                if ((uVar2 >> (uVar13 & 0x1f) & 1) != 0) {
                  Fra_ClausRecordClause(p,pDVar16,uVar13,Scores[lVar14]);
                  uVar8 = *(uint *)&pDVar16->field_0x4;
                }
              }
            }
          }
          pDVar16 = pDVar16 + 1;
          uVar7 = *(undefined8 *)((long)pvVar6 + 0x18);
        }
      }
    }
    Fra_SmlStop(pFVar4);
    Aig_MmFixedStop(p_00,0);
    iVar9 = (int)p_00;
    if (p->fVerbose != 0) {
      Abc_Print(iVar9,"%s =","Infocmb");
      aVar5 = Abc_Clock();
      Abc_Print(iVar9,"%9.2f sec\n",(double)(aVar5 - aVar3) / 1000000.0);
      if (p->fVerbose != 0) {
        printf("Node = %5d. Non-triv cuts = %7d. Clauses = %6d. Clause per cut = %6.2f.\n",
               (double)p->vClauses->nSize / (double)(int)uVar17,
               (ulong)(uint)(p->pAig->nObjs[6] + p->pAig->nObjs[5]),(ulong)uVar17);
      }
    }
    iVar9 = p->vClauses->nSize;
    if (p->nClausesMax < iVar9) {
      Fra_ClausSelectClauses(p);
    }
    else {
      p->nClauses = iVar9;
    }
    iVar9 = 1;
  }
  else {
    puts("Property failed after sequential simulation!");
    Fra_SmlStop(pFVar4);
    iVar9 = 0;
  }
  return iVar9;
}

Assistant:

int Fra_ClausProcessClauses( Clu_Man_t * p, int fRefs )
{
    Aig_MmFixed_t * pMemCuts;
//    Aig_ManCut_t * pManCut;
    Fra_Sml_t * pComb, * pSeq;
    Aig_Obj_t * pObj;
    Dar_Cut_t * pCut;
    int Scores[16], uScores, i, k, j, nCuts = 0;
    abctime clk;

    // simulate the AIG
clk = Abc_Clock();
//    srand( 0xAABBAABB );
    Aig_ManRandom(1);
    pSeq = Fra_SmlSimulateSeq( p->pAig, 0, p->nPref + p->nSimFrames, p->nSimWords/p->nSimFrames, 1 );
    if ( p->fTarget && pSeq->fNonConstOut )
    {
        printf( "Property failed after sequential simulation!\n" );
        Fra_SmlStop( pSeq );
        return 0;
    }
if ( p->fVerbose )
{
ABC_PRT( "Sim-seq", Abc_Clock() - clk );
}


clk = Abc_Clock();
    if ( fRefs )
    {
    Fra_ClausCollectLatchClauses( p, pSeq );
if ( p->fVerbose )
{
ABC_PRT( "Lat-cla", Abc_Clock() - clk );
}
    }


    // generate cuts for all nodes, assign cost, and find best cuts
clk = Abc_Clock();
    pMemCuts = Dar_ManComputeCuts( p->pAig, 10, 0, 1 );
//    pManCut = Aig_ComputeCuts( p->pAig, 10, 4, 0, 1 );
if ( p->fVerbose )
{
ABC_PRT( "Cuts   ", Abc_Clock() - clk );
}

    // collect sequential info for each cut
clk = Abc_Clock();
    Aig_ManForEachNode( p->pAig, pObj, i )
        Dar_ObjForEachCut( pObj, pCut, k )
            if ( pCut->nLeaves > 1 )
            {
                pCut->uTruth = Fra_ClausProcessClausesCut( p, pSeq, pCut, Scores );
//                uScores = Fra_ClausProcessClausesCut2( p, pSeq, pCut, Scores );
//                if ( uScores != pCut->uTruth )
//                {
//                    int x = 0;
//                }
            }
if ( p->fVerbose )
{
ABC_PRT( "Infoseq", Abc_Clock() - clk );
}
    Fra_SmlStop( pSeq );

    // perform combinational simulation
clk = Abc_Clock();
//    srand( 0xAABBAABB );
    Aig_ManRandom(1);
    pComb = Fra_SmlSimulateComb( p->pAig, p->nSimWords + p->nSimWordsPref, 0 );
if ( p->fVerbose )
{
ABC_PRT( "Sim-cmb", Abc_Clock() - clk );
}

    // collect combinational info for each cut
clk = Abc_Clock();
    Aig_ManForEachNode( p->pAig, pObj, i )
        Dar_ObjForEachCut( pObj, pCut, k )
            if ( pCut->nLeaves > 1 )
            {
                nCuts++;
                uScores = Fra_ClausProcessClausesCut( p, pComb, pCut, Scores );
                uScores &= ~pCut->uTruth; pCut->uTruth = 0;
                if ( uScores == 0 )
                    continue;
                // write the clauses
                for ( j = 0; j < (1<<pCut->nLeaves); j++ )
                    if ( uScores & (1 << j) )
                        Fra_ClausRecordClause( p, pCut, j, Scores[j] );

            }
    Fra_SmlStop( pComb );
    Aig_MmFixedStop( pMemCuts, 0 );
//    Aig_ManCutStop( pManCut );
if ( p->fVerbose )
{
ABC_PRT( "Infocmb", Abc_Clock() - clk );
}

    if ( p->fVerbose )
    printf( "Node = %5d. Non-triv cuts = %7d. Clauses = %6d. Clause per cut = %6.2f.\n", 
        Aig_ManNodeNum(p->pAig), nCuts, Vec_IntSize(p->vClauses), 1.0*Vec_IntSize(p->vClauses)/nCuts );

    if ( Vec_IntSize(p->vClauses) > p->nClausesMax )
        Fra_ClausSelectClauses( p );
    else
        p->nClauses = Vec_IntSize( p->vClauses );
    return 1;
}